

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::has_default_value(FieldGeneratorBase *this)

{
  FieldDescriptor *pFVar1;
  LogMessage *other;
  FieldDescriptor FVar2;
  bool bVar3;
  FieldDescriptor *local_50;
  code *local_48 [7];
  
  pFVar1 = this->descriptor_;
  if (*(once_flag **)(pFVar1 + 0x18) != (once_flag *)0x0) {
    local_48[0] = FieldDescriptor::TypeOnceInit;
    local_50 = pFVar1;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar1 + 0x18),local_48,&local_50);
  }
  FVar2 = (FieldDescriptor)0x1;
  switch(pFVar1[2]) {
  case (FieldDescriptor)0x1:
    bVar3 = *(double *)(this->descriptor_ + 0x40) != 0.0;
    goto LAB_002c11cc;
  case (FieldDescriptor)0x2:
    bVar3 = *(float *)(this->descriptor_ + 0x40) != 0.0;
LAB_002c11cc:
    FVar2 = (FieldDescriptor)(-bVar3 & 1);
    break;
  case (FieldDescriptor)0x3:
  case (FieldDescriptor)0x4:
  case (FieldDescriptor)0x6:
  case (FieldDescriptor)0x10:
  case (FieldDescriptor)0x12:
    bVar3 = *(long *)(this->descriptor_ + 0x40) == 0;
    goto LAB_002c1199;
  case (FieldDescriptor)0x5:
  case (FieldDescriptor)0x7:
  case (FieldDescriptor)0xd:
  case (FieldDescriptor)0xf:
  case (FieldDescriptor)0x11:
    bVar3 = *(int *)(this->descriptor_ + 0x40) == 0;
LAB_002c1199:
    FVar2 = (FieldDescriptor)!bVar3;
    break;
  case (FieldDescriptor)0x8:
    FVar2 = this->descriptor_[0x40];
    break;
  case (FieldDescriptor)0x9:
  case (FieldDescriptor)0xa:
  case (FieldDescriptor)0xb:
  case (FieldDescriptor)0xc:
  case (FieldDescriptor)0xe:
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0x12f);
    other = internal::LogMessage::operator<<((LogMessage *)local_48,"Unknown field type.");
    internal::LogFinisher::operator=((LogFinisher *)&local_50,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_48);
  }
  return (bool)FVar2;
}

Assistant:

bool FieldGeneratorBase::has_default_value() {
  switch (descriptor_->type()) {
    case FieldDescriptor::TYPE_ENUM:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      return true;
    case FieldDescriptor::TYPE_DOUBLE:
      return descriptor_->default_value_double() != 0.0;
    case FieldDescriptor::TYPE_FLOAT:
      return descriptor_->default_value_float() != 0.0;
    case FieldDescriptor::TYPE_INT64:
      return descriptor_->default_value_int64() != 0L;
    case FieldDescriptor::TYPE_UINT64:
      return descriptor_->default_value_uint64() != 0L;
    case FieldDescriptor::TYPE_INT32:
      return descriptor_->default_value_int32() != 0;
    case FieldDescriptor::TYPE_FIXED64:
      return descriptor_->default_value_uint64() != 0L;
    case FieldDescriptor::TYPE_FIXED32:
      return descriptor_->default_value_uint32() != 0;
    case FieldDescriptor::TYPE_BOOL:
      return descriptor_->default_value_bool();
    case FieldDescriptor::TYPE_STRING:
      return true;
    case FieldDescriptor::TYPE_BYTES:
      return true;
    case FieldDescriptor::TYPE_UINT32:
      return descriptor_->default_value_uint32() != 0;
    case FieldDescriptor::TYPE_SFIXED32:
      return descriptor_->default_value_int32() != 0;
    case FieldDescriptor::TYPE_SFIXED64:
      return descriptor_->default_value_int64() != 0L;
    case FieldDescriptor::TYPE_SINT32:
      return descriptor_->default_value_int32() != 0;
    case FieldDescriptor::TYPE_SINT64:
      return descriptor_->default_value_int64() != 0L;
    default:
      GOOGLE_LOG(FATAL)<< "Unknown field type.";
      return true;
  }
}